

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O2

Vector * Utils::SolveUpperTriangle(Vector *__return_storage_ptr__,Matrix *m,Vector *b)

{
  ulong uVar1;
  uint uVar2;
  int i;
  int j;
  ulong uVar3;
  double dVar4;
  allocator_type local_41;
  double local_40;
  double local_38;
  
  uVar2 = Matrix::GetCols(m);
  std::vector<double,_std::allocator<double>_>::vector
            (__return_storage_ptr__,(long)(int)uVar2,&local_41);
  uVar3 = (ulong)uVar2;
  while (0 < (int)uVar3) {
    uVar1 = uVar3 - 1;
    local_38 = 0.0;
    while( true ) {
      i = (int)uVar1;
      if ((int)uVar2 <= (int)uVar3) break;
      local_40 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>).
                 _M_impl.super__Vector_impl_data._M_start[uVar3];
      dVar4 = Matrix::operator()(m,i,(int)uVar3);
      local_38 = local_38 + local_40 * dVar4;
      uVar3 = uVar3 + 1;
    }
    local_40 = (b->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar1 & 0xffffffff];
    dVar4 = Matrix::operator()(m,i,i);
    (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar1 & 0xffffffff] = (local_40 - local_38) / dVar4;
    uVar3 = uVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

Vector Utils::SolveUpperTriangle(const Matrix& m, const Vector& b)
{
    const int n = m.GetCols();
    Vector x(n);

    for (int i = n - 1; i >= 0; --i)
    {
        double sum = 0;
        for (int j = i + 1; j < n; ++j)
        {
            sum += x[j] * m(i, j);
        }
        x[i] = (b[i] - sum) / m(i, i);
    }

    return x;
}